

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

Instr * __thiscall
BackwardPass::ProcessPendingPreOpBailOutInfo(BackwardPass *this,Instr *currentInstr)

{
  uint32 uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  BailOutInfo *bailOutInfo;
  Instr *pIVar6;
  Instr *instr;
  Instr *instr_00;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xa18,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) goto LAB_003dc2a8;
    *puVar5 = 0;
  }
  pIVar6 = this->preOpBailOutInstrToProcess;
  if (pIVar6 != (Instr *)0x0) {
    if (pIVar6 != currentInstr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa1e,"(preOpBailOutInstrToProcess == currentInstr)",
                         "preOpBailOutInstrToProcess == currentInstr");
      if (!bVar3) goto LAB_003dc2a8;
      *puVar5 = 0;
      pIVar6 = this->preOpBailOutInstrToProcess;
    }
    if ((this->currentPrePassLoop == (Loop *)0x0) &&
       (instr_00 = pIVar6->m_prev, pIVar6->m_prev != (Instr *)0x0)) {
      do {
        bVar3 = IR::Instr::CanAggregateByteCodeUsesAcrossInstr
                          (this->preOpBailOutInstrToProcess,instr_00);
        if (!bVar3) break;
        pIVar6 = instr_00->m_prev;
        bVar3 = IR::Instr::IsByteCodeUsesInstrFor(instr_00,this->preOpBailOutInstrToProcess);
        if (bVar3) {
          ProcessByteCodeUsesInstr(this,instr_00);
        }
        instr_00 = pIVar6;
      } while (pIVar6 != (Instr *)0x0);
      pIVar6 = this->preOpBailOutInstrToProcess;
    }
    bailOutInfo = IR::Instr::GetBailOutInfo(pIVar6);
    pIVar6 = this->preOpBailOutInstrToProcess;
    if (bailOutInfo->bailOutInstr != pIVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa32,"(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess)",
                         "bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess");
      if (!bVar3) goto LAB_003dc2a8;
      *puVar5 = 0;
      pIVar6 = this->preOpBailOutInstrToProcess;
    }
    uVar1 = bailOutInfo->bailOutOffset;
    uVar4 = IR::Instr::GetByteCodeOffset(pIVar6);
    if (uVar1 != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa33,
                         "(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset())"
                         ,
                         "bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset()"
                        );
      if (!bVar3) {
LAB_003dc2a8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ProcessBailOutInfo(this,this->preOpBailOutInstrToProcess,bailOutInfo);
    this->preOpBailOutInstrToProcess = (Instr *)0x0;
  }
  return currentInstr->m_prev;
}

Assistant:

IR::Instr*
BackwardPass::ProcessPendingPreOpBailOutInfo(IR::Instr *const currentInstr)
{
    Assert(!IsCollectionPass());

    if(!preOpBailOutInstrToProcess)
    {
        return currentInstr->m_prev;
    }
    Assert(preOpBailOutInstrToProcess == currentInstr);

    if (!this->IsPrePass())
    {
        IR::Instr* prev = preOpBailOutInstrToProcess->m_prev;
        while (prev && preOpBailOutInstrToProcess->CanAggregateByteCodeUsesAcrossInstr(prev))
        {
            IR::Instr* instr = prev;
            prev = prev->m_prev;
            if (instr->IsByteCodeUsesInstrFor(preOpBailOutInstrToProcess))
            {
                // If instr is a ByteCodeUsesInstr, it will remove it
                ProcessByteCodeUsesInstr(instr);
            }
        }
    }

    // A pre-op bailout instruction was saved for bailout info processing after the instruction and relevant ByteCodeUses
    // instructions before it have been processed. We can process the bailout info for that instruction now.
    BailOutInfo *const bailOutInfo = preOpBailOutInstrToProcess->GetBailOutInfo();
    Assert(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess);
    Assert(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset());
    ProcessBailOutInfo(preOpBailOutInstrToProcess, bailOutInfo);
    preOpBailOutInstrToProcess = nullptr;

    // We might have removed the prev instr if it was a ByteCodeUsesInstr
    // Update the prevInstr on the main loop
    return currentInstr->m_prev;
}